

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cases.cpp
# Opt level: O0

Clause * __thiscall
Inferences::Cases::performParamodulation(Cases *this,Clause *premise,Literal *lit,TermList t)

{
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
  i;
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  TermList *pTVar4;
  uint64_t in_RCX;
  Term *in_RDX;
  Clause *in_RSI;
  Literal *curr;
  StlIter __end1;
  StlIter __begin1;
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>_>
  *__range1;
  RStack<Literal_*> resLits;
  TermList rhs;
  TermList lhs;
  Term *in_stack_fffffffffffffe68;
  StlIter *rhs_00;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *in_stack_fffffffffffffe70;
  Inference *this_00;
  TermList TVar5;
  TermList in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  Term *in_stack_fffffffffffffeb0;
  Stack<Kernel::Literal_*> *in_stack_fffffffffffffeb8;
  undefined1 polarity;
  TermList in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  TermList in_stack_fffffffffffffed0;
  Term *in_stack_fffffffffffffed8;
  Stack<Kernel::Literal_*> *in_stack_fffffffffffffee0;
  Inference local_110;
  uint64_t local_e0;
  uint64_t local_d8;
  uint64_t local_d0;
  uint64_t local_c8;
  uint64_t local_c0;
  Term *local_b8;
  StlIter *local_90;
  Inference *pIStack_88;
  uint64_t local_80;
  undefined1 local_78 [24];
  undefined1 *local_60;
  TermList local_38;
  TermList local_30;
  Term *local_28;
  Clause *local_20;
  TermList local_10;
  Clause *local_8;
  
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_10._content = in_RCX;
  pTVar4 = Kernel::Term::nthArgument(in_RDX,0);
  local_30._content = pTVar4->_content;
  pTVar4 = Kernel::Term::nthArgument(local_28,1);
  local_38._content = pTVar4->_content;
  bVar1 = Kernel::TermList::operator==(&local_10,&local_30);
  if ((bVar1) || (bVar1 = Kernel::TermList::operator==(&local_10,&local_38), bVar1)) {
    local_8 = (Clause *)0x0;
  }
  else {
    if ((performParamodulation(Kernel::Clause*,Kernel::Literal*,Kernel::TermList)::troo == '\0') &&
       (iVar3 = __cxa_guard_acquire(&performParamodulation(Kernel::Clause*,Kernel::Literal*,Kernel::TermList)
                                     ::troo), iVar3 != 0)) {
      in_stack_fffffffffffffed8 = Kernel::Term::foolTrue();
      Kernel::TermList::TermList((TermList *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      __cxa_guard_release(&performParamodulation(Kernel::Clause*,Kernel::Literal*,Kernel::TermList)
                           ::troo);
    }
    if ((performParamodulation(Kernel::Clause*,Kernel::Literal*,Kernel::TermList)::fols == '\0') &&
       (iVar3 = __cxa_guard_acquire(&performParamodulation(Kernel::Clause*,Kernel::Literal*,Kernel::TermList)
                                     ::fols), iVar3 != 0)) {
      in_stack_fffffffffffffed0._content = (uint64_t)Kernel::Term::foolFalse();
      Kernel::TermList::TermList((TermList *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      __cxa_guard_release(&performParamodulation(Kernel::Clause*,Kernel::Literal*,Kernel::TermList)
                           ::fols);
    }
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    Recycled(in_stack_fffffffffffffe70);
    Kernel::Clause::iterLits((Clause *)in_stack_fffffffffffffe80._content);
    i._iter._inner._next = (int)in_stack_fffffffffffffea8;
    i._iter._inner._from = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
    i._iter._func.a = (Clause *)in_stack_fffffffffffffea0;
    i._iter._16_8_ = in_stack_fffffffffffffeb0;
    Lib::
    iterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>>
              (i);
    local_60 = local_78;
    Lib::
    IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>_>
    ::begin((IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>_>
             *)local_90);
    Lib::
    IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>_>
    ::end((IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>_>
           *)local_90);
    rhs_00 = local_90;
    this_00 = pIStack_88;
    TVar5._content = local_80;
    while( true ) {
      polarity = (undefined1)((ulong)in_stack_fffffffffffffeb8 >> 0x38);
      uVar2 = Lib::operator!=((StlIter *)this_00,rhs_00);
      if (!(bool)uVar2) break;
      in_stack_fffffffffffffec0._content =
           (uint64_t)
           Lib::
           IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>_>
           ::StlIter::operator*((StlIter *)0x78974f);
      local_b8 = *(Term **)in_stack_fffffffffffffec0._content;
      in_stack_fffffffffffffeb8 =
           Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
           ::operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                         *)0x789773);
      in_stack_fffffffffffffeb0 = local_b8;
      if (local_b8 == local_28) {
        local_c0 = local_10._content;
        local_c8 = performParamodulation::troo._content;
        in_stack_fffffffffffffeb0 =
             &Kernel::EqHelper::replace((Literal *)this_00,in_stack_fffffffffffffe80,TVar5)->
              super_Term;
      }
      Lib::Stack<Kernel::Literal_*>::push((Stack<Kernel::Literal_*> *)this_00,(Literal *)rhs_00);
      Lib::
      IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>_>
      ::StlIter::operator++((StlIter *)this_00);
    }
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                *)0x789881);
    local_d0 = local_10._content;
    local_d8 = performParamodulation::fols._content;
    local_e0 = (uint64_t)Kernel::AtomicSort::boolSort();
    TVar5._content._7_1_ = uVar2;
    TVar5._content._0_7_ = in_stack_fffffffffffffec8;
    Kernel::Literal::createEquality
              ((bool)polarity,in_stack_fffffffffffffed0,TVar5,in_stack_fffffffffffffec0);
    Lib::Stack<Kernel::Literal_*>::push((Stack<Kernel::Literal_*> *)this_00,(Literal *)rhs_00);
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    operator*((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)0x789907);
    Kernel::GeneratingInference1::GeneratingInference1
              ((GeneratingInference1 *)&stack0xfffffffffffffee0,FOOL_PARAMODULATION,local_20);
    Kernel::Inference::Inference(this_00,(GeneratingInference1 *)rhs_00);
    local_8 = Kernel::Clause::fromStack
                        (in_stack_fffffffffffffee0,(Inference *)in_stack_fffffffffffffed8);
    Kernel::Inference::~Inference(&local_110);
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    ~Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)in_stack_fffffffffffffeb0);
  }
  return local_8;
}

Assistant:

Clause* Cases::performParamodulation(Clause* premise, Literal* lit, TermList t) {
  ASS(t.isTerm());

  TermList lhs = *lit->nthArgument(0);
  TermList rhs = *lit->nthArgument(1);

  if((t == lhs) || (t == rhs)){
    return 0;
  }

  static TermList troo(Term::foolTrue());
  static TermList fols(Term::foolFalse());


  // Found a boolean term! Create the C[true] \/ s = false clause

  RStack<Literal*> resLits;

  // Copy the literals from the premise except for the one at `literalPosition`,
  // that has the occurrence of `booleanTerm` replaced with false
  for (Literal* curr : iterTraits(premise->iterLits())) {
    resLits->push( curr != lit 
        ? curr
        : EqHelper::replace(curr, t, troo));
  }

  // Add s = false to the clause
  resLits->push(Literal::createEquality(true, t, fols, AtomicSort::boolSort()));

  return Clause::fromStack(*resLits, GeneratingInference1(InferenceRule::FOOL_PARAMODULATION, premise));
}